

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O1

bool wipe_ScreenWipe(int ticks)

{
  bool bVar1;
  
  if (CurrentWipeType != 0) {
    V_MarkRect(0,0,(screen->super_DSimpleCanvas).super_DCanvas.Width,
               (screen->super_DSimpleCanvas).super_DCanvas.Height);
    bVar1 = (*wipes[CurrentWipeType * 3 + -2])(ticks);
    return bVar1;
  }
  return true;
}

Assistant:

bool wipe_ScreenWipe (int ticks)
{
	bool rc;

	if (CurrentWipeType == wipe_None)
		return true;

	// do a piece of wipe-in
	V_MarkRect(0, 0, SCREENWIDTH, SCREENHEIGHT);
	rc = (*wipes[(CurrentWipeType-1)*3+1])(ticks);

	return rc;
}